

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

ENetHost *
enet_host_create(ENetAddress *address,size_t peerCount,size_t channelLimit,
                uint32_t incomingBandwidth,uint32_t outgoingBandwidth,int bufferSize)

{
  undefined8 uVar1;
  undefined2 uVar2;
  ENetSocket EVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ENetHost *pEVar7;
  ENetPeer *pEVar8;
  uint64_t uVar9;
  ENetPeer *pEVar10;
  size_t sVar11;
  ENetPeer *peer;
  
  if (peerCount < 0x1000) {
    pEVar7 = (ENetHost *)(*(code *)callbacks_0)(0x2b10);
    if (pEVar7 == (ENetHost *)0x0) {
      pEVar7 = (ENetHost *)(*(code *)callbacks_2)();
      return pEVar7;
    }
    memset(pEVar7,0,0x2b10);
    pEVar8 = (ENetPeer *)(*(code *)callbacks_0)(peerCount * 0x1e8);
    if (pEVar8 == (ENetPeer *)0x0) {
      pEVar7 = (ENetHost *)(*(code *)callbacks_2)();
      return pEVar7;
    }
    pEVar7->peers = pEVar8;
    memset(pEVar8,0,peerCount * 0x1e8);
    EVar3 = enet_socket_create(ENET_SOCKET_TYPE_DATAGRAM);
    pEVar7->socket = EVar3;
    if (EVar3 == -1) {
      EVar3 = -1;
    }
    else {
      enet_socket_set_option(EVar3,ENET_SOCKOPT_IPV6_V6ONLY,0);
      EVar3 = pEVar7->socket;
    }
    iVar4 = enet_socket_bind(EVar3,address);
    iVar5 = pEVar7->socket;
    if (iVar5 != -1) {
      if ((address == (ENetAddress *)0x0) || (-1 < iVar4)) {
        iVar4 = 0x40000;
        if (0x40000 < bufferSize) {
          iVar4 = bufferSize;
        }
        if (0xfffff < iVar4) {
          iVar4 = 0x100000;
        }
        enet_socket_set_option(iVar5,ENET_SOCKOPT_NONBLOCK,1);
        enet_socket_set_option(pEVar7->socket,ENET_SOCKOPT_BROADCAST,1);
        enet_socket_set_option(pEVar7->socket,ENET_SOCKOPT_RCVBUF,iVar4);
        enet_socket_set_option(pEVar7->socket,ENET_SOCKOPT_SNDBUF,iVar4);
        if (address != (ENetAddress *)0x0) {
          iVar5 = enet_socket_get_address(pEVar7->socket,&pEVar7->address);
          if (iVar5 < 0) {
            uVar2 = *(undefined2 *)&address->field_0x12;
            (pEVar7->address).port = address->port;
            *(undefined2 *)&(pEVar7->address).field_0x12 = uVar2;
            uVar1 = *(undefined8 *)((long)&address->field_0 + 8);
            *(undefined8 *)&(pEVar7->address).field_0 = *(undefined8 *)&address->field_0;
            *(undefined8 *)((long)&(pEVar7->address).field_0 + 8) = uVar1;
          }
        }
        sVar11 = 0xff;
        if (0xffffffffffffff00 < channelLimit - 0x100) {
          sVar11 = channelLimit;
        }
        pEVar7->randomSeed = (uint32_t)pEVar7;
        uVar9 = enet_host_random_seed();
        uVar6 = (int)uVar9 + pEVar7->randomSeed;
        pEVar7->randomSeed = uVar6 * 0x10000 | uVar6 >> 0x10;
        pEVar7->channelLimit = sVar11;
        pEVar7->incomingBandwidth = incomingBandwidth;
        pEVar7->outgoingBandwidth = outgoingBandwidth;
        pEVar7->bandwidthThrottleEpoch = 0;
        pEVar7->recalculateBandwidthLimits = 0;
        pEVar7->preventConnections = '\0';
        pEVar7->mtu = 0x500;
        pEVar7->peerCount = peerCount;
        pEVar7->commandCount = 0;
        pEVar7->bufferCount = 0;
        pEVar7->checksumCallback = (ENetChecksumCallback)0x0;
        uVar1 = _setsockopt;
        *(undefined8 *)&(pEVar7->receivedAddress).field_0 = _in6addr_any;
        *(undefined8 *)((long)&(pEVar7->receivedAddress).field_0 + 8) = uVar1;
        (pEVar7->receivedAddress).port = 0;
        pEVar7->totalSentData = 0;
        pEVar7->totalSentPackets = 0;
        pEVar7->totalReceivedData = 0;
        pEVar7->totalReceivedPackets = 0;
        pEVar7->receivedData = (uint8_t *)0x0;
        pEVar7->receivedDataLength = 0;
        pEVar7->connectedPeers = 0;
        pEVar7->bandwidthLimitedPeers = 0;
        pEVar7->duplicatePeers = 0xfff;
        pEVar7->maximumPacketSize = 0x2000000;
        pEVar7->maximumWaitingData = 0x2000000;
        pEVar7->interceptCallback = (ENetInterceptCallback)0x0;
        (pEVar7->dispatchQueue).sentinel.next = &(pEVar7->dispatchQueue).sentinel;
        (pEVar7->dispatchQueue).sentinel.previous = &(pEVar7->dispatchQueue).sentinel;
        pEVar8 = pEVar7->peers;
        pEVar10 = pEVar8;
        for (peer = pEVar8; peer < pEVar8 + peerCount; peer = peer + 1) {
          peer->host = pEVar7;
          peer->incomingPeerID = (uint16_t)(((long)pEVar10 - (long)pEVar8) / 0x1e8);
          peer->outgoingSessionID = 0xff;
          peer->incomingSessionID = 0xff;
          peer->data = (void *)0x0;
          (peer->acknowledgements).sentinel.next = &(peer->acknowledgements).sentinel;
          (peer->acknowledgements).sentinel.previous = &(peer->acknowledgements).sentinel;
          (peer->sentReliableCommands).sentinel.next = &(peer->sentReliableCommands).sentinel;
          (peer->sentReliableCommands).sentinel.previous = &(peer->sentReliableCommands).sentinel;
          (peer->sentUnreliableCommands).sentinel.next = &(peer->sentUnreliableCommands).sentinel;
          (peer->sentUnreliableCommands).sentinel.previous =
               &(peer->sentUnreliableCommands).sentinel;
          (peer->outgoingCommands).sentinel.next = &(peer->outgoingCommands).sentinel;
          (peer->outgoingCommands).sentinel.previous = &(peer->outgoingCommands).sentinel;
          (peer->dispatchedCommands).sentinel.next = &(peer->dispatchedCommands).sentinel;
          (peer->dispatchedCommands).sentinel.previous = &(peer->dispatchedCommands).sentinel;
          enet_peer_reset(peer);
          pEVar8 = pEVar7->peers;
          peerCount = pEVar7->peerCount;
          pEVar10 = pEVar10 + 1;
        }
        return pEVar7;
      }
      enet_socket_destroy(iVar5);
    }
    (*(code *)callbacks_1)(pEVar7->peers);
    (*(code *)callbacks_1)(pEVar7);
  }
  return (ENetHost *)0x0;
}

Assistant:

ENetHost* enet_host_create(const ENetAddress* address, size_t peerCount, size_t channelLimit, uint32_t incomingBandwidth, uint32_t outgoingBandwidth, int bufferSize) {
	ENetHost* host;
	ENetPeer* currentPeer;

	ENET_LOG_TRACE("Creating ENet host object.");

	if (peerCount > ENET_PROTOCOL_MAXIMUM_PEER_ID) {
		ENET_LOG_ERROR("Creation failure: Peer count greater than maximum allowed (%u)", ENET_PROTOCOL_MAXIMUM_PEER_ID);
		return NULL;
	}

	host = (ENetHost*)enet_malloc(sizeof(ENetHost));

	if (host == NULL) {
		ENET_LOG_ERROR("Creation failure: Memory allocation failure. Wanted %u bytes", sizeof(ENetHost));
		return NULL;
	}

	memset(host, 0, sizeof(ENetHost));

	host->peers = (ENetPeer*)enet_malloc(peerCount * sizeof(ENetPeer));

	if (host->peers == NULL) {
		ENET_LOG_ERROR("Creation failure: Peer array memory allocation failure. Wanted %u bytes", peerCount * sizeof(ENetHost));
		enet_free(host);

		return NULL;
	}

	memset(host->peers, 0, peerCount * sizeof(ENetPeer));

	host->socket = enet_socket_create(ENET_SOCKET_TYPE_DATAGRAM);

	if (host->socket != ENET_SOCKET_NULL) {
		ENET_LOG_TRACE("Socket creation: IPv4 & IPv6 dual stack mode");
		enet_socket_set_option(host->socket, ENET_SOCKOPT_IPV6_V6ONLY, 0);
	}

	int bindResult = enet_socket_bind(host->socket, address);

	if (host->socket == ENET_SOCKET_NULL || (address != NULL && bindResult < 0)) {
		if (host->socket != ENET_SOCKET_NULL) {
			ENET_LOG_TRACE("Socket creation: Cleaning up a old socket.");
			enet_socket_destroy(host->socket);
		}

		ENET_LOG_ERROR("Socket creation: Binding to socket failed with error code %i", bindResult);
		enet_free(host->peers);
		enet_free(host);

		return NULL;
	}

	ENET_LOG_TRACE("Buffers: Setting up");
	if (bufferSize > ENET_HOST_BUFFER_SIZE_MAX)
		bufferSize = ENET_HOST_BUFFER_SIZE_MAX;
	else if (bufferSize < ENET_HOST_BUFFER_SIZE_MIN)
		bufferSize = ENET_HOST_BUFFER_SIZE_MIN;

	ENET_LOG_TRACE("Socket: Setting up options");
	enet_socket_set_option(host->socket, ENET_SOCKOPT_NONBLOCK, 1);
	enet_socket_set_option(host->socket, ENET_SOCKOPT_BROADCAST, 1);
	enet_socket_set_option(host->socket, ENET_SOCKOPT_RCVBUF, bufferSize);
	enet_socket_set_option(host->socket, ENET_SOCKOPT_SNDBUF, bufferSize);

	ENET_LOG_TRACE("Address: Setting up");
	if (address != NULL && enet_socket_get_address(host->socket, &host->address) < 0)
		host->address = *address;

	ENET_LOG_TRACE("Channels: Setting up");
	if (!channelLimit || channelLimit > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
		channelLimit = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;
	else if (channelLimit < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
		channelLimit = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;

	host->randomSeed = (uint32_t)(size_t)host;
	host->randomSeed += enet_host_random_seed();
	host->randomSeed = (host->randomSeed << 16) | (host->randomSeed >> 16);
	host->channelLimit = channelLimit;
	host->incomingBandwidth = incomingBandwidth;
	host->outgoingBandwidth = outgoingBandwidth;
	host->bandwidthThrottleEpoch = 0;
	host->recalculateBandwidthLimits = 0;
	host->preventConnections = 0;
	host->mtu = ENET_HOST_DEFAULT_MTU;
	host->peerCount = peerCount;
	host->commandCount = 0;
	host->bufferCount = 0;
	host->checksumCallback = NULL;
	host->receivedAddress.ipv6 = ENET_HOST_ANY;
	host->receivedAddress.port = 0;
	host->receivedData = NULL;
	host->receivedDataLength = 0;
	host->totalSentData = 0;
	host->totalSentPackets = 0;
	host->totalReceivedData = 0;
	host->totalReceivedPackets = 0;
	host->connectedPeers = 0;
	host->bandwidthLimitedPeers = 0;
	host->duplicatePeers = ENET_PROTOCOL_MAXIMUM_PEER_ID;
	host->maximumPacketSize = ENET_HOST_DEFAULT_MAXIMUM_PACKET_SIZE;
	host->maximumWaitingData = ENET_HOST_DEFAULT_MAXIMUM_WAITING_DATA;
	host->interceptCallback = NULL;

	ENET_LOG_TRACE("Startup: Clearing queues");
	enet_list_clear(&host->dispatchQueue);

	for (currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
		currentPeer->host = host;
		currentPeer->incomingPeerID = currentPeer - host->peers;
		currentPeer->outgoingSessionID = currentPeer->incomingSessionID = 0xFF;
		currentPeer->data = NULL;

		enet_list_clear(&currentPeer->acknowledgements);
		enet_list_clear(&currentPeer->sentReliableCommands);
		enet_list_clear(&currentPeer->sentUnreliableCommands);
		enet_list_clear(&currentPeer->outgoingCommands);
		enet_list_clear(&currentPeer->dispatchedCommands);
		enet_peer_reset(currentPeer);
	}

	ENET_LOG_TRACE("Startup: Complete. Let's do this.");
	return host;
}